

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall
HecrSequential_cyclicReductionNumericalSchemeLikeSystem_Test::TestBody
          (HecrSequential_cyclicReductionNumericalSchemeLikeSystem_Test *this)

{
  bool bVar1;
  long lVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  allocator_type *paVar6;
  char *message;
  byte bVar7;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  AssertionResult gtest_ar;
  vec solution;
  vec xs;
  vec rhs;
  vec cs;
  vec bs;
  vec as;
  TridiagonalMatrix m;
  double xs_values [15];
  double rhs_values [15];
  double cs_values [15];
  double bs_values [15];
  double as_values [15];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_388;
  AssertHelper local_380;
  internal local_378 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  vec local_368;
  void *local_350;
  long local_348;
  long local_340;
  vec local_338;
  vec local_320;
  vec local_308;
  vec local_2f0;
  TridiagonalMatrix local_2d8;
  allocator_type local_288 [120];
  double local_210;
  allocator_type local_208 [120];
  double local_190;
  allocator_type local_188 [120];
  double local_110;
  allocator_type local_108 [120];
  double local_90;
  double local_88 [15];
  double local_10;
  
  bVar7 = 0;
  pdVar3 = (double *)&DAT_001436b0;
  pdVar5 = local_88;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar5 = *pdVar3;
    pdVar3 = pdVar3 + 1;
    pdVar5 = pdVar5 + 1;
  }
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_2f0,local_88,&local_10,local_108);
  pdVar3 = (double *)&DAT_00143730;
  paVar6 = local_108;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(double *)paVar6 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar7 * -2 + 1;
    paVar6 = paVar6 + ((ulong)bVar7 * -2 + 1) * 8;
  }
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_308,(double *)local_108,&local_90,
             local_188);
  pdVar3 = (double *)&DAT_001437b0;
  paVar6 = local_188;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(double *)paVar6 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar7 * -2 + 1;
    paVar6 = paVar6 + ((ulong)bVar7 * -2 + 1) * 8;
  }
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_320,(double *)local_188,&local_110,
             local_208);
  TridiagonalMatrix::TridiagonalMatrix(&local_2d8,&local_2f0,&local_308,&local_320);
  pdVar3 = (double *)&DAT_00143830;
  paVar6 = local_208;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(double *)paVar6 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar7 * -2 + 1;
    paVar6 = paVar6 + ((ulong)bVar7 * -2 + 1) * 8;
  }
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_338,(double *)local_208,&local_190,
             local_288);
  pdVar3 = (double *)&DAT_001438b0;
  paVar6 = local_288;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(double *)paVar6 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar7 * -2 + 1;
    paVar6 = paVar6 + ((ulong)bVar7 * -2 + 1) * 8;
  }
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_350,(double *)local_288,&local_210,
             (allocator_type *)&local_368);
  cyclic_reduction(&local_368,&local_2d8,&local_338);
  if (local_348 - (long)local_350 == 0) {
    local_388.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    uVar4 = 0;
    pbVar8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      local_388.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ABS(*(double *)((long)local_350 + uVar4 * 8) -
               local_368.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4]);
      if ((double)local_388.ptr_ <= (double)pbVar8) {
        local_388.ptr_ = pbVar8;
      }
      uVar4 = uVar4 + 1;
      pbVar8 = local_388.ptr_;
    } while ((uVar4 & 0xffffffff) < (ulong)(local_348 - (long)local_350 >> 3));
  }
  testing::internal::CmpHelperLT<double,double>
            (local_378,"max_diff(xs, solution)","EPS",(double *)&local_388,&EPS);
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_388);
    if (local_370.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_370.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0xab,message);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if (local_388.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_388.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_388.ptr_ + 8))();
      }
      local_388.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_368.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_368.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_368.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_368.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_350 != (void *)0x0) {
    operator_delete(local_350,local_340 - (long)local_350);
  }
  if (local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2d8.cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8.cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d8.cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2d8.bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8.bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d8.bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2d8.as.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8.as.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d8.as.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.as.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_320.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_320.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_320.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_320.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(HecrSequential, cyclicReductionNumericalSchemeLikeSystem)
{
    int size = 15;
    const double as_values[] = { 3, 3, 3, 3, 3, 3, 3, 3, 3,
            3, 3, 1, 1, 1, 1 };
    vec as = make_vector(size, as_values);
    const double bs_values[] = { 0, 1.5, 1.5, 1.5, 1.5, 1.5, 1.5, 1.5, 1.5,
            1.5, 1.5, 0, 0, 0, 0 };
    vec bs = make_vector(size, bs_values);
    const double cs_values[] = { 1.5, 1.5, 1.5, 1.5, 1.5, 1.5, 1.5, 1.5, 1.5,
            1.5, 0, 0, 0, 0, 0 };
    vec cs = make_vector(size, cs_values);
    TridiagonalMatrix m(as, bs, cs);
    const double rhs_values[] = { 21, 13.5, -10.5, 9, 52.5, 51, 22.5, 9, -27,
            -43.5, -1.5, 0, 0, 0, 0 };
    vec rhs = make_vector(size, rhs_values);
    const double xs_values[] = { 4, 6, -7, 1, 11, 12, -1, 5, -3,
            -17, 8, 0, 0, 0, 0 };
    vec xs = make_vector(size, xs_values);

    vec solution = cyclic_reduction(m, rhs);

    EXPECT_LT(max_diff(xs, solution), EPS);
}